

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O1

int ReadSymTab(char *label)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  byte *pbVar4;
  ulong uVar5;
  SymTab *pSVar6;
  char wnum [6];
  char wlab [128];
  char local_9e [6];
  byte local_98 [128];
  
  strcpy((char *)local_98,label);
  cVar1 = *label;
  if (cVar1 == '\\' || (byte)(cVar1 - 0x30U) < 10) {
    if (cVar1 == '\\') {
      sVar3 = strlen((char *)local_98);
      (local_98 + sVar3)[0] = 0x24;
      (local_98 + sVar3)[1] = 0;
    }
    sprintf(local_9e,"%d",(ulong)(uint)LabLine);
    strcat((char *)local_98,local_9e);
  }
  uVar5 = 0x1505;
  if (local_98[0] != 0) {
    pbVar4 = local_98;
    do {
      pbVar4 = pbVar4 + 1;
      uVar5 = (ulong)local_98[0] + uVar5 * 0x21;
      local_98[0] = *pbVar4;
    } while (local_98[0] != 0);
  }
  pSVar6 = (SymTab *)(Hash + (uVar5 & HashSize));
  do {
    pSVar6 = pSVar6->Link;
    if (pSVar6 == (SymTab *)0x0) {
      Sym = pSVar6;
      Hunk2 = 0x7fff;
      DefLine2 = 0x7fff;
      Value = 0;
      return 0;
    }
    Sym = pSVar6;
    iVar2 = strcmp(pSVar6->Nam,(char *)local_98);
  } while (iVar2 != 0);
  Hunk2 = pSVar6->Hunk;
  if ((pSVar6->Flags & 9) == 0) {
    Hunk2 = Hunk2 & 0xffff;
  }
  Value = pSVar6->Val;
  DefLine2 = pSVar6->Defn;
  return 1;
}

Assistant:

int ReadSymTab(label)
	char label[];
/* Searches the symbol table for the given label.
 If not found, points Sym to NULL and returns FALSE.
 If found, points Sym to the proper table entry,
 and sets up the following fields:
 Value    - value of symbol
 Hunk2    - hunk number in which symbol resides
 ABSHUNK if value is absolute
 ones complement of symbol table index if external
 DefLine2 - statement number in which symbol was defined
 (NODEF if undefined )
 If the label is a local label (i.e. the first character is
 numeric), the current contents of LabLine will be converted
 to characters and appended to the label before it is searched.
 (This matches the way AddSymTab added the label to the table.)
 If the first character of the label is a backslash (i.e. a
 named local variable) a dollar sign will be appended to the
 label ahead of the value of LabLine.                       */
{
	char wlab[MAXLINE], wnum[6];
	register struct SymTab **hashindex;

	strcpy(wlab, label);
	if (((label[0] >= '0') && (label[0] <= '9')) || (label[0] == '\\')) {
		if (label[0] == '\\')
			strcat(wlab, "$");
		sprintf(wnum, "%d", LabLine); /* If it's a local label, */
		strcat(wlab, wnum); /*    append LabLine.     */
	}
	hashindex = HashIt(wlab); /* Get hash index. */
	Sym = *hashindex;
	while (Sym != NULL) {
		if (strcmp(Sym->Nam, wlab) == 0) {
			Value = Sym->Val; /* We found it. */
			Hunk2 = Sym->Hunk;
			if (!(Sym->Flags & 9))
				Hunk2 &= 0x0000FFFFL; /* Isolate hunk number. */
			DefLine2 = Sym->Defn;
			return (TRUE);
		}
		Sym = Sym->Link;
	}
	Value = 0; /* We didn't find it - */
	Hunk2 = ABSHUNK; /*  set value to absolute zero. */
	DefLine2 = NODEF;
	return (FALSE);
}